

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

mg_str * mg_get_http_header(http_message *hm,char *name)

{
  int iVar1;
  size_t len;
  mg_str *pmVar2;
  
  len = strlen(name);
  pmVar2 = hm->header_values;
  while( true ) {
    if (pmVar2[-0x28].len == 0) {
      return (mg_str *)0x0;
    }
    if ((pmVar2[-0x28].len == len && pmVar2[-0x28].p != (char *)0x0) &&
       (iVar1 = mg_ncasecmp(pmVar2[-0x28].p,name,len), iVar1 == 0)) break;
    pmVar2 = pmVar2 + 1;
  }
  return pmVar2;
}

Assistant:

struct mg_str *mg_get_http_header(struct http_message *hm, const char *name) {
    size_t i, len = strlen(name);

    for (i = 0; hm->header_names[i].len > 0; i++) {
        struct mg_str *h = &hm->header_names[i], *v = &hm->header_values[i];
        if (h->p != NULL && h->len == len && !mg_ncasecmp(h->p, name, len))
            return v;
    }

    return NULL;
}